

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::eval_refract_vec2(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float res;
  float fVar12;
  
  fVar1 = c->in[0].m_data[1];
  fVar2 = c->in[0].m_data[3];
  uVar4 = *(undefined8 *)c->in[1].m_data;
  fVar10 = (float)uVar4;
  fVar11 = (float)((ulong)uVar4 >> 0x20);
  fVar3 = c->in[2].m_data[1];
  fVar12 = 0.0;
  fVar7 = fVar11;
  fVar8 = fVar2;
  bVar5 = true;
  do {
    bVar6 = bVar5;
    fVar12 = fVar12 + fVar7 * fVar8;
    fVar7 = fVar10;
    fVar8 = fVar1;
    bVar5 = false;
  } while (bVar6);
  fVar7 = 1.0 - fVar3 * fVar3 * (1.0 - fVar12 * fVar12);
  fVar8 = 0.0;
  fVar9 = 0.0;
  if (0.0 <= fVar7) {
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar7 = fVar3 * fVar12 + fVar7;
    fVar8 = fVar3 * fVar2 - fVar11 * fVar7;
    fVar9 = fVar3 * fVar1 - fVar10 * fVar7;
  }
  *(ulong *)((c->color).m_data + 1) = CONCAT44(fVar9,fVar8);
  return;
}

Assistant:

void eval_refract_vec2	(ShaderEvalContext& c) { c.color.yz()	= refract(c.in[0].swizzle(3, 1),       c.in[1].swizzle(1, 0),       c.in[2].y()); }